

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void highbd_dc_128_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 0;
  if (bh < 1) {
    bh = iVar1;
  }
  for (; iVar1 != bh; iVar1 = iVar1 + 1) {
    for (uVar2 = 0; (uint)bw != uVar2; uVar2 = uVar2 + 1) {
      dst[uVar2] = (uint16_t)(0x80 << ((char)above - 8U & 0x1f));
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_dc_128_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)left;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, 128 << (bd - 8), bw);
    dst += stride;
  }
}